

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

void reuse_conn(connectdata *old_conn,connectdata *conn)

{
  connectdata *conn_local;
  connectdata *old_conn_local;
  
  free_fixed_hostname(&(old_conn->http_proxy).host);
  free_fixed_hostname(&(old_conn->socks_proxy).host);
  (*Curl_cfree)((old_conn->http_proxy).host.rawalloc);
  (*Curl_cfree)((old_conn->socks_proxy).host.rawalloc);
  Curl_free_primary_ssl_config(&old_conn->ssl_config);
  Curl_free_primary_ssl_config(&old_conn->proxy_ssl_config);
  conn->data = old_conn->data;
  (conn->bits).user_passwd = (_Bool)((old_conn->bits).user_passwd & 1);
  if (((conn->bits).user_passwd & 1U) != 0) {
    (*Curl_cfree)(conn->user);
    conn->user = (char *)0x0;
    (*Curl_cfree)(conn->passwd);
    conn->passwd = (char *)0x0;
    conn->user = old_conn->user;
    conn->passwd = old_conn->passwd;
    old_conn->user = (char *)0x0;
    old_conn->passwd = (char *)0x0;
  }
  (conn->bits).proxy_user_passwd = (_Bool)((old_conn->bits).proxy_user_passwd & 1);
  if (((conn->bits).proxy_user_passwd & 1U) != 0) {
    (*Curl_cfree)((conn->http_proxy).user);
    (conn->http_proxy).user = (char *)0x0;
    (*Curl_cfree)((conn->socks_proxy).user);
    (conn->socks_proxy).user = (char *)0x0;
    (*Curl_cfree)((conn->http_proxy).passwd);
    (conn->http_proxy).passwd = (char *)0x0;
    (*Curl_cfree)((conn->socks_proxy).passwd);
    (conn->socks_proxy).passwd = (char *)0x0;
    (conn->http_proxy).user = (old_conn->http_proxy).user;
    (conn->socks_proxy).user = (old_conn->socks_proxy).user;
    (conn->http_proxy).passwd = (old_conn->http_proxy).passwd;
    (conn->socks_proxy).passwd = (old_conn->socks_proxy).passwd;
    (old_conn->http_proxy).user = (char *)0x0;
    (old_conn->socks_proxy).user = (char *)0x0;
    (old_conn->http_proxy).passwd = (char *)0x0;
    (old_conn->socks_proxy).passwd = (char *)0x0;
  }
  free_fixed_hostname(&conn->host);
  free_fixed_hostname(&conn->conn_to_host);
  (*Curl_cfree)((conn->host).rawalloc);
  (conn->host).rawalloc = (char *)0x0;
  (*Curl_cfree)((conn->conn_to_host).rawalloc);
  (conn->conn_to_host).rawalloc = (char *)0x0;
  (conn->host).rawalloc = (old_conn->host).rawalloc;
  (conn->host).encalloc = (old_conn->host).encalloc;
  (conn->host).name = (old_conn->host).name;
  (conn->host).dispname = (old_conn->host).dispname;
  (conn->bits).conn_to_host = (_Bool)((old_conn->bits).conn_to_host & 1);
  (conn->conn_to_host).rawalloc = (old_conn->conn_to_host).rawalloc;
  (conn->conn_to_host).encalloc = (old_conn->conn_to_host).encalloc;
  (conn->conn_to_host).name = (old_conn->conn_to_host).name;
  (conn->conn_to_host).dispname = (old_conn->conn_to_host).dispname;
  (conn->bits).conn_to_port = (_Bool)((old_conn->bits).conn_to_port & 1);
  conn->conn_to_port = old_conn->conn_to_port;
  Curl_persistconninfo(conn);
  (conn->bits).reuse = true;
  (*Curl_cfree)(old_conn->user);
  old_conn->user = (char *)0x0;
  (*Curl_cfree)(old_conn->passwd);
  old_conn->passwd = (char *)0x0;
  (*Curl_cfree)((old_conn->http_proxy).user);
  (old_conn->http_proxy).user = (char *)0x0;
  (*Curl_cfree)((old_conn->socks_proxy).user);
  (old_conn->socks_proxy).user = (char *)0x0;
  (*Curl_cfree)((old_conn->http_proxy).passwd);
  (old_conn->http_proxy).passwd = (char *)0x0;
  (*Curl_cfree)((old_conn->socks_proxy).passwd);
  (old_conn->socks_proxy).passwd = (char *)0x0;
  (*Curl_cfree)(old_conn->localdev);
  old_conn->localdev = (char *)0x0;
  Curl_llist_destroy(&old_conn->send_pipe,(void *)0x0);
  Curl_llist_destroy(&old_conn->recv_pipe,(void *)0x0);
  (*Curl_cfree)(old_conn->master_buffer);
  old_conn->master_buffer = (char *)0x0;
  return;
}

Assistant:

static void reuse_conn(struct connectdata *old_conn,
                       struct connectdata *conn)
{
  free_fixed_hostname(&old_conn->http_proxy.host);
  free_fixed_hostname(&old_conn->socks_proxy.host);

  free(old_conn->http_proxy.host.rawalloc);
  free(old_conn->socks_proxy.host.rawalloc);

  /* free the SSL config struct from this connection struct as this was
     allocated in vain and is targeted for destruction */
  Curl_free_primary_ssl_config(&old_conn->ssl_config);
  Curl_free_primary_ssl_config(&old_conn->proxy_ssl_config);

  conn->data = old_conn->data;

  /* get the user+password information from the old_conn struct since it may
   * be new for this request even when we re-use an existing connection */
  conn->bits.user_passwd = old_conn->bits.user_passwd;
  if(conn->bits.user_passwd) {
    /* use the new user name and password though */
    Curl_safefree(conn->user);
    Curl_safefree(conn->passwd);
    conn->user = old_conn->user;
    conn->passwd = old_conn->passwd;
    old_conn->user = NULL;
    old_conn->passwd = NULL;
  }

  conn->bits.proxy_user_passwd = old_conn->bits.proxy_user_passwd;
  if(conn->bits.proxy_user_passwd) {
    /* use the new proxy user name and proxy password though */
    Curl_safefree(conn->http_proxy.user);
    Curl_safefree(conn->socks_proxy.user);
    Curl_safefree(conn->http_proxy.passwd);
    Curl_safefree(conn->socks_proxy.passwd);
    conn->http_proxy.user = old_conn->http_proxy.user;
    conn->socks_proxy.user = old_conn->socks_proxy.user;
    conn->http_proxy.passwd = old_conn->http_proxy.passwd;
    conn->socks_proxy.passwd = old_conn->socks_proxy.passwd;
    old_conn->http_proxy.user = NULL;
    old_conn->socks_proxy.user = NULL;
    old_conn->http_proxy.passwd = NULL;
    old_conn->socks_proxy.passwd = NULL;
  }

  /* host can change, when doing keepalive with a proxy or if the case is
     different this time etc */
  free_fixed_hostname(&conn->host);
  free_fixed_hostname(&conn->conn_to_host);
  Curl_safefree(conn->host.rawalloc);
  Curl_safefree(conn->conn_to_host.rawalloc);
  conn->host=old_conn->host;
  conn->bits.conn_to_host = old_conn->bits.conn_to_host;
  conn->conn_to_host = old_conn->conn_to_host;
  conn->bits.conn_to_port = old_conn->bits.conn_to_port;
  conn->conn_to_port = old_conn->conn_to_port;

  /* persist connection info in session handle */
  Curl_persistconninfo(conn);

  conn_reset_all_postponed_data(old_conn); /* free buffers */

  /* re-use init */
  conn->bits.reuse = TRUE; /* yes, we're re-using here */

  Curl_safefree(old_conn->user);
  Curl_safefree(old_conn->passwd);
  Curl_safefree(old_conn->http_proxy.user);
  Curl_safefree(old_conn->socks_proxy.user);
  Curl_safefree(old_conn->http_proxy.passwd);
  Curl_safefree(old_conn->socks_proxy.passwd);
  Curl_safefree(old_conn->localdev);

  Curl_llist_destroy(&old_conn->send_pipe, NULL);
  Curl_llist_destroy(&old_conn->recv_pipe, NULL);

  Curl_safefree(old_conn->master_buffer);

#ifdef USE_UNIX_SOCKETS
  Curl_safefree(old_conn->unix_domain_socket);
#endif
}